

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void HE16_SSE2(uint8_t *dst)

{
  uint8_t *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  
  for (lVar2 = 0; (int)lVar2 != 0x200; lVar2 = lVar2 + 0x20) {
    auVar4 = ZEXT216(CONCAT11(dst[lVar2 + -1],dst[lVar2 + -1]));
    auVar4 = pshuflw(auVar4,auVar4,0);
    uVar3 = auVar4._0_4_;
    puVar1 = dst + lVar2;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 8) = uVar3;
    *(undefined4 *)(puVar1 + 0xc) = uVar3;
  }
  return;
}

Assistant:

static void HE16_SSE2(uint8_t* dst) {     // horizontal
  int j;
  for (j = 16; j > 0; --j) {
    const __m128i values = _mm_set1_epi8(dst[-1]);
    _mm_storeu_si128((__m128i*)dst, values);
    dst += BPS;
  }
}